

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptbuilder.cpp
# Opt level: O0

void __thiscall
ScriptBuilder_AppendFunctionTest1ByOperator_Test::TestBody
          (ScriptBuilder_AppendFunctionTest1ByOperator_Test *this)

{
  bool bVar1;
  ScriptBuilder *pSVar2;
  char *pcVar3;
  char *pcVar4;
  AssertHelper local_240;
  Message local_238;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> local_230;
  size_type local_218;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_2;
  Message local_1f8;
  string local_1f0 [32];
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_1;
  Message local_1b8;
  string local_1b0 [32];
  undefined1 local_190 [8];
  AssertionResult gtest_ar;
  size_t expect_size;
  string local_170 [8];
  string expect_asm;
  string local_148 [8];
  string expect_hex;
  long local_110;
  Pubkey local_108;
  ScriptBuilder local_f0;
  undefined1 local_d0 [8];
  Script actual;
  string local_90 [8];
  string pubkey_hash;
  string local_68 [8];
  string pubkey;
  allocator local_31;
  string local_30 [8];
  string sig;
  ScriptBuilder_AppendFunctionTest1ByOperator_Test *this_local;
  
  sig.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_30,
             "304402203dd0c408e173d6b7252eabc7e3f6a0c632d930a7b343eaf60e7ebee9eb01adcc02204a567cb6a941c88f24f4c4201633468d53810fae9cdb90f35571e6b52bed005e"
             ,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_68,
             "042322ed12f2779cae32ca89f15d61d10e3bd725d74d45269b05a34abb91b45a2ca19cc8734300deaf74d006871b5cd0730f2384037d16843663a0327fce24aef0"
             ,(allocator *)(pubkey_hash.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(pubkey_hash.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_90,"aea58b2d64af22fe06b95c46af4e471e6280226c",
             (allocator *)
             ((long)&actual.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&actual.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ScriptBuilder::ScriptBuilder(&local_f0);
  pSVar2 = (ScriptBuilder *)cfd::core::ScriptBuilder::operator<<(&local_f0,local_30);
  cfd::core::Pubkey::Pubkey(&local_108,local_68);
  pSVar2 = (ScriptBuilder *)cfd::core::ScriptBuilder::operator<<(pSVar2,&local_108);
  local_110 = 0x90;
  pSVar2 = (ScriptBuilder *)cfd::core::ScriptBuilder::operator<<(pSVar2,&local_110);
  pSVar2 = (ScriptBuilder *)cfd::core::ScriptBuilder::operator<<(pSVar2,kOpCheckLockTimeVerify);
  pSVar2 = (ScriptBuilder *)
           cfd::core::ScriptBuilder::operator<<
                     (pSVar2,(ScriptOperator *)&cfd::core::ScriptOperator::OP_DROP);
  pSVar2 = (ScriptBuilder *)
           cfd::core::ScriptBuilder::operator<<
                     (pSVar2,(ScriptOperator *)&cfd::core::ScriptOperator::OP_DUP);
  pSVar2 = (ScriptBuilder *)
           cfd::core::ScriptBuilder::operator<<
                     (pSVar2,(ScriptOperator *)&cfd::core::ScriptOperator::OP_HASH160);
  cfd::core::ByteData160::ByteData160((ByteData160 *)((long)&expect_hex.field_2 + 8),local_90);
  pSVar2 = (ScriptBuilder *)
           cfd::core::ScriptBuilder::operator<<
                     (pSVar2,(ByteData160 *)((long)&expect_hex.field_2 + 8));
  pSVar2 = (ScriptBuilder *)
           cfd::core::ScriptBuilder::operator<<
                     (pSVar2,(ScriptOperator *)&cfd::core::ScriptOperator::OP_EQUALVERIFY);
  cfd::core::ScriptBuilder::operator<<
            (pSVar2,(ScriptOperator *)&cfd::core::ScriptOperator::OP_CHECKSIG);
  cfd::core::ScriptBuilder::Build();
  cfd::core::ByteData160::~ByteData160((ByteData160 *)((long)&expect_hex.field_2 + 8));
  cfd::core::Pubkey::~Pubkey(&local_108);
  cfd::core::ScriptBuilder::~ScriptBuilder(&local_f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_148,
             "46304402203dd0c408e173d6b7252eabc7e3f6a0c632d930a7b343eaf60e7ebee9eb01adcc02204a567cb6a941c88f24f4c4201633468d53810fae9cdb90f35571e6b52bed005e41042322ed12f2779cae32ca89f15d61d10e3bd725d74d45269b05a34abb91b45a2ca19cc8734300deaf74d006871b5cd0730f2384037d16843663a0327fce24aef0029000b17576a914aea58b2d64af22fe06b95c46af4e471e6280226c88ac"
             ,(allocator *)(expect_asm.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(expect_asm.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_170,
             "304402203dd0c408e173d6b7252eabc7e3f6a0c632d930a7b343eaf60e7ebee9eb01adcc02204a567cb6a941c88f24f4c4201633468d53810fae9cdb90f35571e6b52bed005e 042322ed12f2779cae32ca89f15d61d10e3bd725d74d45269b05a34abb91b45a2ca19cc8734300deaf74d006871b5cd0730f2384037d16843663a0327fce24aef0 144 OP_CHECKLOCKTIMEVERIFY OP_DROP OP_DUP OP_HASH160 aea58b2d64af22fe06b95c46af4e471e6280226c OP_EQUALVERIFY OP_CHECKSIG"
             ,(allocator *)((long)&expect_size + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&expect_size + 7));
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xa;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cfd::core::Script::GetHex_abi_cxx11_();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_190,"expect_hex.c_str()","actual.GetHex().c_str()",pcVar3,pcVar4);
  std::__cxx11::string::~string(local_1b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
  if (!bVar1) {
    testing::Message::Message(&local_1b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0x96,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_1b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cfd::core::Script::ToString_abi_cxx11_();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1d0,"expect_asm.c_str()","actual.ToString().c_str()",pcVar3,pcVar4);
  std::__cxx11::string::~string(local_1f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar1) {
    testing::Message::Message(&local_1f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0x97,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  cfd::core::Script::GetElementList();
  local_218 = std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::size
                        (&local_230);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_210,"expect_size","actual.GetElementList().size()",
             (unsigned_long *)&gtest_ar.message_,&local_218);
  std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
            (&local_230);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
  if (!bVar1) {
    testing::Message::Message(&local_238);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
    testing::internal::AssertHelper::AssertHelper
              (&local_240,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0x98,pcVar3);
    testing::internal::AssertHelper::operator=(&local_240,&local_238);
    testing::internal::AssertHelper::~AssertHelper(&local_240);
    testing::Message::~Message(&local_238);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  std::__cxx11::string::~string(local_170);
  std::__cxx11::string::~string(local_148);
  cfd::core::Script::~Script((Script *)local_d0);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

TEST(ScriptBuilder, AppendFunctionTest1ByOperator) {
  std::string sig =
  "304402203dd0c408e173d6b7252eabc7e3f6a0c632d930a7b343eaf60e7ebee9eb01adcc02204a567cb6a941c88f24f4c4201633468d53810fae9cdb90f35571e6b52bed005e";  // NOLINT
  std::string pubkey =
  "042322ed12f2779cae32ca89f15d61d10e3bd725d74d45269b05a34abb91b45a2ca19cc8734300deaf74d006871b5cd0730f2384037d16843663a0327fce24aef0";// NOLINT
  std::string pubkey_hash = "aea58b2d64af22fe06b95c46af4e471e6280226c";

  // ref: https://en.bitcoin.it/wiki/Script#Script_examples
  // Freezing funds until a time in the future
  Script actual = (ScriptBuilder() << sig << Pubkey(pubkey) << 144
      << ScriptType::kOpCheckLockTimeVerify
      << ScriptOperator::OP_DROP << ScriptOperator::OP_DUP
      << ScriptOperator::OP_HASH160 << ByteData160(pubkey_hash)
      << ScriptOperator::OP_EQUALVERIFY << ScriptOperator::OP_CHECKSIG).Build();

  std::string expect_hex =
  "46304402203dd0c408e173d6b7252eabc7e3f6a0c632d930a7b343eaf60e7ebee9eb01adcc02204a567cb6a941c88f24f4c4201633468d53810fae9cdb90f35571e6b52bed005e41042322ed12f2779cae32ca89f15d61d10e3bd725d74d45269b05a34abb91b45a2ca19cc8734300deaf74d006871b5cd0730f2384037d16843663a0327fce24aef0029000b17576a914aea58b2d64af22fe06b95c46af4e471e6280226c88ac";// NOLINT
  std::string expect_asm =
  "304402203dd0c408e173d6b7252eabc7e3f6a0c632d930a7b343eaf60e7ebee9eb01adcc02204a567cb6a941c88f24f4c4201633468d53810fae9cdb90f35571e6b52bed005e 042322ed12f2779cae32ca89f15d61d10e3bd725d74d45269b05a34abb91b45a2ca19cc8734300deaf74d006871b5cd0730f2384037d16843663a0327fce24aef0 144 OP_CHECKLOCKTIMEVERIFY OP_DROP OP_DUP OP_HASH160 aea58b2d64af22fe06b95c46af4e471e6280226c OP_EQUALVERIFY OP_CHECKSIG";// NOLINT
  size_t expect_size = 10;

  EXPECT_STREQ(expect_hex.c_str(), actual.GetHex().c_str());
  EXPECT_STREQ(expect_asm.c_str(), actual.ToString().c_str());
  EXPECT_EQ(expect_size, actual.GetElementList().size());
}